

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

void __thiscall
choc::value::Type::addObjectMember(Type *this,string_view memberName,Type *memberType)

{
  uint32_t *puVar1;
  Content *pCVar2;
  MainType MVar3;
  uint uVar4;
  Object *pOVar5;
  Allocator *pAVar6;
  Object *pOVar7;
  Object *pOVar8;
  int iVar9;
  ulong uVar10;
  char *__dest;
  MemberNameAndType *pMVar11;
  size_t __n;
  MemberNameAndType *m;
  MemberNameAndType *pMVar12;
  size_type size;
  
  __n = memberName._M_len;
  if (this->mainType != object) {
    throwError("This type is not an object");
  }
  pOVar5 = (this->content).object;
  uVar10 = (ulong)(pOVar5->members).size;
  if (uVar10 != 0) {
    pMVar12 = (pOVar5->members).items;
    pMVar11 = pMVar12 + uVar10;
    do {
      if ((pMVar12->name)._M_len == __n) {
        if (__n == 0) {
LAB_001c040e:
          throwError("This object already contains a member with the given name");
        }
        iVar9 = bcmp((pMVar12->name)._M_str,memberName._M_str,__n);
        if (iVar9 == 0) goto LAB_001c040e;
      }
      pMVar12 = pMVar12 + 1;
    } while (pMVar12 != pMVar11);
  }
  if (this->allocator == (Allocator *)0x0) {
    __dest = (char *)malloc(__n + 1);
  }
  else {
    __dest = (char *)(**(code **)(*(long *)this->allocator + 0x10))();
  }
  memcpy(__dest,memberName._M_str,__n);
  __dest[__n] = '\0';
  MVar3 = memberType->mainType;
  pOVar7 = (memberType->content).object;
  pOVar8 = *(Object **)((long)&memberType->content + 8);
  pAVar6 = memberType->allocator;
  memberType->mainType = void_;
  AllocatedVector<choc::value::MemberNameAndType>::reserve
            (&pOVar5->members,(pOVar5->members).size + 1);
  pMVar12 = (pOVar5->members).items;
  uVar4 = (pOVar5->members).size;
  pMVar12[uVar4].name._M_len = __n;
  pMVar12[uVar4].name._M_str = __dest;
  pMVar12[uVar4].type.mainType = MVar3;
  pCVar2 = &pMVar12[uVar4].type.content;
  pCVar2->object = pOVar7;
  (&pCVar2->object)[1] = pOVar8;
  pMVar12[uVar4].type.allocator = pAVar6;
  puVar1 = &(pOVar5->members).size;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

inline void Type::addObjectMember (std::string_view memberName, Type memberType)
{
    check (getObjectMemberIndex (memberName) < 0, "This object already contains a member with the given name");
    content.object->members.push_back ({ allocateString (allocator, memberName), std::move (memberType) });
}